

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O2

UINT8 device_start_pwm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  DEV_DATA DVar2;
  uint uVar3;
  
  DVar2.chipInf = calloc(1,0x20);
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(UINT32 *)((long)DVar2.chipInf + 0x1c) = cfg->clock;
    if (cfg->srMode == '\x02') {
      uVar3 = 0x5604;
      if (0x5604 < cfg->smplRate) {
        uVar3 = cfg->smplRate;
      }
    }
    else {
      uVar3 = 0x5604;
      if (cfg->srMode == '\x01') {
        uVar3 = cfg->smplRate;
      }
    }
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar3;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_pwm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	pwm_chip *chip;
	UINT32 rate;
	
	chip = (pwm_chip *)calloc(1, sizeof(pwm_chip));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	
	rate = 22020;	// that's the rate the PWM uses in most games
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	//PWM_Init(chip);
	pwm_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef);
	return 0x00;
}